

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt__GetGlyfOffset(stbtt_fontinfo *info,int glyph_index)

{
  int iVar1;
  uchar *puVar2;
  stbtt_uint32 sVar3;
  stbtt_uint32 sVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = -1;
  if ((glyph_index < info->numGlyphs) && (info->indexToLocFormat < 2)) {
    iVar5 = info->loca;
    puVar2 = info->data;
    iVar1 = info->glyf;
    if (info->indexToLocFormat == 0) {
      lVar6 = (long)glyph_index;
      sVar3 = (uint)puVar2[lVar6 * 2 + (long)iVar5] * 0x200 +
              (uint)puVar2[lVar6 * 2 + (long)iVar5 + 1] * 2;
      sVar4 = (uint)puVar2[lVar6 * 2 + (long)iVar5 + 2] * 0x200 +
              (uint)puVar2[lVar6 * 2 + (long)iVar5 + 3] * 2;
    }
    else {
      sVar3 = ttULONG(puVar2 + (long)(glyph_index << 2) + (long)iVar5);
      sVar4 = ttULONG(puVar2 + (long)(glyph_index << 2) + (long)iVar5 + 4);
    }
    iVar5 = -1;
    if (sVar3 != sVar4) {
      iVar5 = iVar1 + sVar3;
    }
  }
  return iVar5;
}

Assistant:

static int stbtt__GetGlyfOffset(const stbtt_fontinfo *info, int glyph_index)
{
   int g1,g2;

   if (glyph_index >= info->numGlyphs) return -1; // glyph index out of range
   if (info->indexToLocFormat >= 2)    return -1; // unknown index->glyph map format

   if (info->indexToLocFormat == 0) {
      g1 = info->glyf + ttUSHORT(info->data + info->loca + glyph_index * 2) * 2;
      g2 = info->glyf + ttUSHORT(info->data + info->loca + glyph_index * 2 + 2) * 2;
   } else {
      g1 = info->glyf + ttULONG (info->data + info->loca + glyph_index * 4);
      g2 = info->glyf + ttULONG (info->data + info->loca + glyph_index * 4 + 4);
   }

   return g1==g2 ? -1 : g1; // if length is 0, return -1
}